

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragIntRange2
               (char *label,int *v_current_min,int *v_current_max,float v_speed,int v_min,int v_max,
               char *format,char *format_max)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  int v_min_00;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  char *text_end;
  int iVar6;
  float w_full;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    PushID(label);
    BeginGroup();
    w_full = CalcItemWidth();
    PushMultiItemsWidths(2,w_full);
    iVar1 = *v_current_max;
    iVar6 = iVar1;
    if (v_max < iVar1) {
      iVar6 = v_max;
    }
    v_min_00 = v_min;
    if (v_max <= v_min) {
      iVar6 = iVar1;
      v_min_00 = -0x80000000;
    }
    bVar4 = DragInt("##min",v_current_min,v_speed,v_min_00,iVar6,format);
    PopItemWidth();
    SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
    iVar1 = *v_current_min;
    iVar6 = iVar1;
    if (iVar1 < v_min) {
      iVar6 = v_min;
    }
    if (v_max <= v_min) {
      iVar6 = iVar1;
      v_max = 0x7fffffff;
    }
    if (format_max == (char *)0x0) {
      format_max = format;
    }
    bVar5 = DragInt("##max",v_current_max,v_speed,iVar6,v_max,format_max);
    bVar5 = bVar5 || bVar4;
    PopItemWidth();
    SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextEx(label,text_end,0);
    EndGroup();
    PopID();
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}